

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

Vec_Wec_t * Acb_DeriveCnfForWindow(Acb_Ntk_t *p,Vec_Int_t *vWin,int PivotVar)

{
  int iVar1;
  int iVar2;
  Vec_Str_t *pVVar3;
  int i;
  
  if ((p->vCnfs).nSize == (p->vObjType).nSize) {
    for (i = 0; i < vWin->nSize; i = i + 1) {
      iVar1 = Vec_IntEntry(vWin,i);
      iVar2 = Abc_LitIsCompl(iVar1);
      if ((PivotVar <= i) || (iVar2 == 0)) {
        iVar1 = Abc_Lit2Var(iVar1);
        pVVar3 = Acb_ObjCnfs(p,iVar1);
        if (pVVar3->nSize < 1) {
          Acb_DeriveCnfForWindowOne(p,iVar1);
        }
      }
    }
    return &p->vCnfs;
  }
  __assert_fail("Vec_WecSize(vCnfs) == Acb_NtkObjNumMax(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                ,0x6c,"Vec_Wec_t *Acb_DeriveCnfForWindow(Acb_Ntk_t *, Vec_Int_t *, int)");
}

Assistant:

Vec_Wec_t * Acb_DeriveCnfForWindow( Acb_Ntk_t * p, Vec_Int_t * vWin, int PivotVar )
{
    Vec_Wec_t * vCnfs = &p->vCnfs;
    Vec_Str_t * vCnfBase; int i, iObj;
    assert( Vec_WecSize(vCnfs) == Acb_NtkObjNumMax(p) );
    Vec_IntForEachEntry( vWin, iObj, i )
    {
        if ( Abc_LitIsCompl(iObj) && i < PivotVar )
            continue;
        iObj = Abc_Lit2Var(iObj);
        vCnfBase = Acb_ObjCnfs( p, iObj );
        if ( Vec_StrSize(vCnfBase) > 0 )
            continue;
        Acb_DeriveCnfForWindowOne( p, iObj );
    }
    return vCnfs;
}